

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O0

void searchCurrencyName(CurrencyNameStruct *currencyNames,int32_t total_currency_count,UChar *text,
                       int32_t textLen,int32_t *partialMatchLen,int32_t *maxMatchLen,
                       int32_t *maxMatchIndex)

{
  int local_4c;
  int local_48;
  int local_44;
  int32_t index;
  int32_t binarySearchEnd;
  int32_t binarySearchBegin;
  int32_t matchIndex;
  int32_t *maxMatchLen_local;
  int32_t *partialMatchLen_local;
  UChar *pUStack_20;
  int32_t textLen_local;
  UChar *text_local;
  CurrencyNameStruct *pCStack_10;
  int32_t total_currency_count_local;
  CurrencyNameStruct *currencyNames_local;
  
  *maxMatchIndex = -1;
  *maxMatchLen = 0;
  binarySearchEnd = -1;
  index = 0;
  local_44 = total_currency_count + -1;
  local_48 = 0;
  _binarySearchBegin = maxMatchLen;
  maxMatchLen_local = partialMatchLen;
  partialMatchLen_local._4_4_ = textLen;
  pUStack_20 = text;
  text_local._4_4_ = total_currency_count;
  pCStack_10 = currencyNames;
  while( true ) {
    if (partialMatchLen_local._4_4_ <= local_48) {
      return;
    }
    binarySearchEnd = binarySearch(pCStack_10,local_48,pUStack_20[local_48],&index,&local_44);
    if (index == -1) break;
    if (*maxMatchLen_local < local_48 + 1) {
      local_4c = local_48 + 1;
    }
    else {
      local_4c = *maxMatchLen_local;
    }
    *maxMatchLen_local = local_4c;
    if (binarySearchEnd != -1) {
      *_binarySearchBegin = local_48 + 1;
      *maxMatchIndex = binarySearchEnd;
    }
    if (local_44 - index < 10) {
      linearSearch(pCStack_10,index,local_44,pUStack_20,partialMatchLen_local._4_4_,
                   maxMatchLen_local,_binarySearchBegin,maxMatchIndex);
      return;
    }
    local_48 = local_48 + 1;
  }
  return;
}

Assistant:

static void
searchCurrencyName(const CurrencyNameStruct* currencyNames, 
                   int32_t total_currency_count,
                   const UChar* text, int32_t textLen,
                   int32_t *partialMatchLen,
                   int32_t* maxMatchLen, int32_t* maxMatchIndex) {
    *maxMatchIndex = -1;
    *maxMatchLen = 0;
    int32_t matchIndex = -1;
    int32_t binarySearchBegin = 0;
    int32_t binarySearchEnd = total_currency_count - 1;
    // It is a variant of binary search.
    // For example, given the currency names in currencyNames array are:
    // A AB ABC AD AZ B BB BBEX BBEXYZ BS C D E....
    // and the input text is BBEXST
    // The first round binary search search "B" in the text against
    // the first char in currency names, and find the first char matching range
    // to be "B BB BBEX BBEXYZ BS" (and the maximum matching "B").
    // The 2nd round binary search search the second "B" in the text against
    // the 2nd char in currency names, and narrow the matching range to
    // "BB BBEX BBEXYZ" (and the maximum matching "BB").
    // The 3rd round returnes the range as "BBEX BBEXYZ" (without changing
    // maximum matching).
    // The 4th round returns the same range (the maximum matching is "BBEX").
    // The 5th round returns no matching range.
    for (int32_t index = 0; index < textLen; ++index) {
        // matchIndex saves the one with exact match till the current point.
        // [binarySearchBegin, binarySearchEnd] saves the matching range.
        matchIndex = binarySearch(currencyNames, index,
                                  text[index],
                                  &binarySearchBegin, &binarySearchEnd);
        if (binarySearchBegin == -1) { // did not find the range
            break;
        }
        *partialMatchLen = MAX(*partialMatchLen, index + 1);
        if (matchIndex != -1) { 
            // find an exact match for text from text[0] to text[index] 
            // in currencyNames array.
            *maxMatchLen = index + 1;
            *maxMatchIndex = matchIndex;
        }
        if (binarySearchEnd - binarySearchBegin < LINEAR_SEARCH_THRESHOLD) {
            // linear search if within threshold.
            linearSearch(currencyNames, binarySearchBegin, binarySearchEnd,
                         text, textLen,
                         partialMatchLen,
                         maxMatchLen, maxMatchIndex);
            break;
        }
    }
    return;
}